

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata.cpp
# Opt level: O0

void __thiscall
duckdb::roaring::ContainerMetadataCollection::Deserialize
          (ContainerMetadataCollection *this,data_ptr_t src,idx_t container_count)

{
  bool bVar1;
  idx_t iVar2;
  byte *pbVar3;
  pointer __n;
  uchar *__dest;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  long in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  idx_t arrays_size;
  idx_t runs_size;
  value_type type;
  idx_t i;
  idx_t runs_count;
  idx_t types_size;
  size_type in_stack_ffffffffffffffa8;
  undefined2 uVar4;
  data_ptr_t in_stack_ffffffffffffffb8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  byte in_stack_ffffffffffffffcf;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  pointer local_28;
  data_ptr_t local_10;
  
  AlignValue<unsigned_long,_32UL>((unsigned_long)in_RDX);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (in_stack_ffffffffffffffd0,CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8)
            );
  in_RDI[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_RDX;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI);
  iVar2 = BitpackingPrimitives::GetRequiredSize
                    ((idx_t)in_RDI,(bitpacking_width_t)(in_stack_ffffffffffffffa8 >> 0x38));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xa05a73);
  BitpackingPrimitives::UnPackBuffer<unsigned_char>
            ((data_ptr_t)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(idx_t)in_RDI,
             (bitpacking_width_t)(in_stack_ffffffffffffffa8 >> 0x38),
             SUB81(in_stack_ffffffffffffffa8 >> 0x30,0));
  local_10 = (data_ptr_t)(iVar2 + in_RSI);
  local_28 = (pointer)0x0;
  for (this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0; this_00 < in_RDX;
      this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                ((long)&(this_00->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                        ._M_impl.super__Vector_impl_data._M_start + 1)) {
    pbVar3 = vector<unsigned_char,_true>::operator[]
                       ((vector<unsigned_char,_true> *)in_RDI,in_stack_ffffffffffffffa8);
    in_stack_ffffffffffffffcf = *pbVar3;
    local_28 = local_28 + (((int)(uint)in_stack_ffffffffffffffcf >> 1 & 1U) == 1);
  }
  in_RDI[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = local_28;
  uVar4 = (undefined2)((ulong)(in_RDI + 1) >> 0x30);
  AlignValue<unsigned_long,_32UL>((unsigned_long)local_28);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (this_00,CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (this_00,CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8));
  if (local_28 != (pointer)0x0) {
    in_stack_ffffffffffffffc0 =
         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
         BitpackingPrimitives::GetRequiredSize
                   ((idx_t)in_RDI,(bitpacking_width_t)((ushort)uVar4 >> 8));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xa05b6f);
    BitpackingPrimitives::UnPackBuffer<unsigned_char>
              ((data_ptr_t)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(idx_t)in_RDI,
               (bitpacking_width_t)((ushort)uVar4 >> 8),SUB21(uVar4,0));
    local_10 = local_10 +
               (long)&in_stack_ffffffffffffffc0->
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  }
  bVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    (in_stack_ffffffffffffffc0);
  if (!bVar1) {
    __n = (pointer)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI + 2);
    in_RDI[3].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = __n;
    __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0xa05bdb);
    memcpy(__dest,local_10,(size_t)__n);
  }
  return;
}

Assistant:

void ContainerMetadataCollection::Deserialize(data_ptr_t src, idx_t container_count) {
	container_type.resize(AlignValue<idx_t, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE>(container_count));
	count_in_segment = container_count;

	// Load the types of the containers
	idx_t types_size = BitpackingPrimitives::GetRequiredSize(container_type.size(), 2);
	BitpackingPrimitives::UnPackBuffer<uint8_t>(container_type.data(), src, container_count, 2, true);
	src += types_size;

	// Figure out how many are run containers
	idx_t runs_count = 0;
	for (idx_t i = 0; i < container_count; i++) {
		auto type = container_type[i];
		runs_count += ((type >> 1) & 1) == 1;
	}
	runs_in_segment = runs_count;
	number_of_runs.resize(AlignValue<idx_t, BitpackingPrimitives::BITPACKING_ALGORITHM_GROUP_SIZE>(runs_count));
	cardinality.resize(container_count - runs_count);

	// Load the run containers
	if (runs_count) {
		idx_t runs_size = BitpackingPrimitives::GetRequiredSize(runs_count, RUN_CONTAINER_SIZE_BITWIDTH);
		BitpackingPrimitives::UnPackBuffer<uint8_t>(number_of_runs.data(), src, runs_count, RUN_CONTAINER_SIZE_BITWIDTH,
		                                            true);
		src += runs_size;
	}

	// Load the array/bitset containers
	if (!cardinality.empty()) {
		idx_t arrays_size = sizeof(uint8_t) * cardinality.size();
		arrays_in_segment = arrays_size;
		memcpy(cardinality.data(), src, arrays_size);
	}
}